

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::_InternalSerialize
          (FieldDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  FieldOptions *this_00;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar2 & 2) != 0) {
    psVar3 = (this->extendee_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.extendee");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->extendee_).ptr_,target);
  }
  if ((uVar2 & 0x40) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->number_;
    *target = '\x18';
    if ((ulong)(long)(int)uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      uVar7 = (ulong)(long)(int)uVar5 >> 7;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)uVar7;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar9 = target;
          puVar9[-1] = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = puVar9 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar1);
        *puVar9 = (uint8)uVar8;
      }
    }
  }
  if ((uVar2 >> 9 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->label_;
    *target = ' ';
    if ((ulong)(long)(int)uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      uVar7 = (ulong)(long)(int)uVar5 >> 7;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)uVar7;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar9 = target;
          puVar9[-1] = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = puVar9 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar1);
        *puVar9 = (uint8)uVar8;
      }
    }
  }
  if ((uVar2 >> 10 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->type_;
    *target = '(';
    if ((ulong)(long)(int)uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      uVar7 = (ulong)(long)(int)uVar5 >> 7;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)uVar7;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar9 = target;
          puVar9[-1] = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = puVar9 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar1);
        *puVar9 = (uint8)uVar8;
      }
    }
  }
  if ((uVar2 & 4) != 0) {
    psVar3 = (this->type_name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.type_name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,6,(this->type_name_).ptr_,target);
  }
  if ((uVar2 & 8) != 0) {
    psVar3 = (this->default_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.default_value");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,7,(this->default_value_).ptr_,target);
  }
  if ((uVar2 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = 'B';
    uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          puVar9 = puVar10 + 1;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar1);
        *puVar10 = (uint8)uVar6;
      }
    }
    target = FieldOptions::_InternalSerialize(this_00,puVar9,stream);
  }
  if ((char)uVar2 < '\0') {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->oneof_index_;
    *target = 'H';
    if ((ulong)(long)(int)uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      uVar7 = (ulong)(long)(int)uVar5 >> 7;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)uVar7;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar9 = target;
          puVar9[-1] = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = puVar9 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar1);
        *puVar9 = (uint8)uVar8;
      }
    }
  }
  if ((uVar2 & 0x10) != 0) {
    psVar3 = (this->json_name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FieldDescriptorProto.json_name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,10,(this->json_name_).ptr_,target);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->proto3_optional_;
    target[0] = 0x88;
    target[1] = '\x01';
    target[2] = bVar1;
    target = target + 3;
  }
  pvVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return target;
  }
  puVar9 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar9;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FieldDescriptorProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string extendee = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_extendee().data(), static_cast<int>(this->_internal_extendee().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.extendee");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_extendee(), target);
  }

  // optional int32 number = 3;
  if (cached_has_bits & 0x00000040u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (cached_has_bits & 0x00000200u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (cached_has_bits & 0x00000400u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      5, this->_internal_type(), target);
  }

  // optional string type_name = 6;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_type_name().data(), static_cast<int>(this->_internal_type_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.type_name");
    target = stream->WriteStringMaybeAliased(
        6, this->_internal_type_name(), target);
  }

  // optional string default_value = 7;
  if (cached_has_bits & 0x00000008u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_default_value().data(), static_cast<int>(this->_internal_default_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.default_value");
    target = stream->WriteStringMaybeAliased(
        7, this->_internal_default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (cached_has_bits & 0x00000020u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        8, _Internal::options(this), target, stream);
  }

  // optional int32 oneof_index = 9;
  if (cached_has_bits & 0x00000080u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_oneof_index(), target);
  }

  // optional string json_name = 10;
  if (cached_has_bits & 0x00000010u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_json_name().data(), static_cast<int>(this->_internal_json_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.json_name");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_json_name(), target);
  }

  // optional bool proto3_optional = 17;
  if (cached_has_bits & 0x00000100u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(17, this->_internal_proto3_optional(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}